

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O2

bool cmSystemTools::CreateTar
               (char *outFileName,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *files,cmTarCompression compressType,bool verbose,string *mtime,string *format)

{
  pointer pbVar1;
  bool bVar2;
  undefined4 uVar3;
  Compress c;
  pointer pbVar4;
  allocator<char> local_395;
  undefined4 local_394;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> path;
  string cwd;
  string local_350;
  string local_330;
  cmArchiveWrite a;
  ofstream fout;
  byte abStack_210 [480];
  
  cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
            (&cwd,(SystemTools *)0x1,SUB41(compressType,0));
  std::ofstream::ofstream(&fout,outFileName,_S_out|_S_bin);
  if ((abStack_210[*(long *)(_fout + -0x18)] & 5) == 0) {
    c = CompressNone;
    if (compressType < TarCompressNone) {
      c = *(Compress *)(&DAT_001b2170 + (ulong)compressType * 4);
    }
    if (format->_M_string_length == 0) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&path,"paxr",&local_395);
    }
    else {
      std::__cxx11::string::string((string *)&path,(string *)format);
    }
    cmArchiveWrite::cmArchiveWrite(&a,(ostream *)&fout,c,&path);
    std::__cxx11::string::~string((string *)&path);
    std::__cxx11::string::_M_assign((string *)&a.MTime);
    pbVar1 = (files->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    local_394 = (undefined4)CONCAT71((int7)((ulong)&a.Error >> 8),1);
    a.Verbose = verbose;
    for (pbVar4 = (files->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start; pbVar4 != pbVar1; pbVar4 = pbVar4 + 1)
    {
      std::__cxx11::string::string((string *)&path,(string *)pbVar4);
      bVar2 = cmsys::SystemTools::FileIsFullPath(&path);
      if (bVar2) {
        RelativePath(&local_330,&cwd,&path);
        std::__cxx11::string::operator=((string *)&path,(string *)&local_330);
        std::__cxx11::string::~string((string *)&local_330);
      }
      std::__cxx11::string::string((string *)&local_350,(string *)&path);
      bVar2 = cmArchiveWrite::Add(&a,&local_350,0,(char *)0x0,true);
      std::__cxx11::string::~string((string *)&local_350);
      if (!bVar2) {
        std::__cxx11::string::string((string *)&local_330,(string *)&a.Error);
        Error(&local_330);
        std::__cxx11::string::~string((string *)&local_330);
        local_394 = 0;
      }
      std::__cxx11::string::~string((string *)&path);
    }
    cmArchiveWrite::~cmArchiveWrite(&a);
    uVar3 = local_394;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&a,"Cannot open output file \"",(allocator<char> *)&path);
    std::__cxx11::string::append((char *)&a);
    std::__cxx11::string::append((char *)&a);
    cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
    std::__cxx11::string::append((string *)&a);
    std::__cxx11::string::~string((string *)&path);
    Error((string *)&a);
    std::__cxx11::string::~string((string *)&a);
    uVar3 = 0;
  }
  std::ofstream::~ofstream(&fout);
  std::__cxx11::string::~string((string *)&cwd);
  return (bool)((byte)uVar3 & 1);
}

Assistant:

bool cmSystemTools::CreateTar(const char* outFileName,
                              const std::vector<std::string>& files,
                              cmTarCompression compressType, bool verbose,
                              std::string const& mtime,
                              std::string const& format)
{
#if defined(CMAKE_BUILD_WITH_CMAKE)
  std::string cwd = cmSystemTools::GetCurrentWorkingDirectory();
  cmsys::ofstream fout(outFileName, std::ios::out | std::ios::binary);
  if (!fout) {
    std::string e = "Cannot open output file \"";
    e += outFileName;
    e += "\": ";
    e += cmSystemTools::GetLastSystemError();
    cmSystemTools::Error(e);
    return false;
  }
  cmArchiveWrite::Compress compress = cmArchiveWrite::CompressNone;
  switch (compressType) {
    case TarCompressGZip:
      compress = cmArchiveWrite::CompressGZip;
      break;
    case TarCompressBZip2:
      compress = cmArchiveWrite::CompressBZip2;
      break;
    case TarCompressXZ:
      compress = cmArchiveWrite::CompressXZ;
      break;
    case TarCompressNone:
      compress = cmArchiveWrite::CompressNone;
      break;
  }

  cmArchiveWrite a(fout, compress, format.empty() ? "paxr" : format);

  a.SetMTime(mtime);
  a.SetVerbose(verbose);
  bool tarCreatedSuccessfully = true;
  for (auto path : files) {
    if (cmSystemTools::FileIsFullPath(path)) {
      // Get the relative path to the file.
      path = cmSystemTools::RelativePath(cwd, path);
    }
    if (!a.Add(path)) {
      cmSystemTools::Error(a.GetError());
      tarCreatedSuccessfully = false;
    }
  }
  return tarCreatedSuccessfully;
#else
  (void)outFileName;
  (void)files;
  (void)verbose;
  return false;
#endif
}